

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

void Acec_MultFuncTest6(void)

{
  uint uVar1;
  Vec_Wrd_t *vRes;
  ulong uVar2;
  word Entry;
  word Canon;
  word Truth;
  
  vRes = Vec_WrdAlloc(10000);
  Truth = 0xfedcba9876543210;
  Canon = Extra_TruthCanonNPN3(0xfedcba9876543210,6,vRes);
  Extra_PrintHex(_stdout,(uint *)&Truth,6);
  putchar(10);
  Extra_PrintHex(_stdout,(uint *)&Canon,6);
  putchar(10);
  uVar1 = vRes->nSize;
  printf("Members = %d.\n",(ulong)uVar1);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    Entry = vRes->pArray[uVar2];
    Extra_PrintHex(_stdout,(uint *)&Entry,6);
    printf(", ");
    if ((~(uint)uVar2 & 7) == 0) {
      putchar(10);
    }
  }
  Vec_WrdFree(vRes);
  return;
}

Assistant:

void Acec_MultFuncTest6()
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 10000 );
    int i; word Entry;

    word Truth = ABC_CONST(0xfedcba9876543210);
    word Canon = Extra_TruthCanonNPN3( Truth, 6, vRes );

    Extra_PrintHex( stdout, (unsigned*)&Truth, 6 );  printf( "\n" );
    Extra_PrintHex( stdout, (unsigned*)&Canon, 6 );  printf( "\n" );

    printf( "Members = %d.\n", Vec_WrdSize(vRes) );
    Vec_WrdForEachEntry( vRes, Entry, i )
    {
        Extra_PrintHex( stdout, (unsigned*)&Entry, 6 );  
        printf( ", " );
        if ( i % 8 == 7 )
            printf( "\n" );
    }

    Vec_WrdFree( vRes );
}